

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O3

void __thiscall Solution::print(Solution *this)

{
  Solution *pSVar1;
  size_t sVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ostream *poVar4;
  _List_node_base *p_Var5;
  undefined8 *puVar6;
  Solution *local_38;
  
  if (Utils::raw_rows_abi_cxx11_.super__List_base<Point_*,_std::allocator<Point_*>_>._M_impl._M_node
      .super__List_node_base._M_next != (_List_node_base *)&Utils::raw_rows_abi_cxx11_) {
    p_Var5 = Utils::raw_rows_abi_cxx11_.super__List_base<Point_*,_std::allocator<Point_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    do {
      local_38 = this;
      std::
      _Hashtable<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase((_Hashtable<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(p_Var5[1]._M_next + 2),&local_38);
      p_Var5 = (((_List_base<Point_*,_std::allocator<Point_*>_> *)&p_Var5->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
    } while (p_Var5 != (_List_node_base *)&Utils::raw_rows_abi_cxx11_);
  }
  for (pSVar1 = (Solution *)
                (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; pSVar1 != this;
      pSVar1 = (Solution *)
               (pSVar1->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
               _M_node.super__List_node_base._M_next) {
    sVar2 = (pSVar1->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
            _M_node._M_size;
    for (puVar6 = *(undefined8 **)(sVar2 + 8); puVar6 != (undefined8 *)(sVar2 + 8);
        puVar6 = (undefined8 *)*puVar6) {
      puVar3 = (undefined8 *)puVar6[2];
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[3];
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)*puVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  }
  return;
}

Assistant:

void Solution::print() {
    for (auto point: Utils::raw_rows) {
        point->state.erase(this);
    }

    for (auto vehicle: vehicles) {
        for (auto node: vehicle->nodes) {
            std::cout << node->p->id << " ";
        }
        std::cout << "\n";
    }
}